

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void glcts::prepareTextureCoordinatesForGatherForFace
               (GLfloat *data,GLuint width,GLuint height,GLfloat layer,GLuint face)

{
  GLuint i;
  long lVar1;
  float fVar2;
  GLfloat GVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  GLfloat GVar10;
  float fVar11;
  GLfloat GVar12;
  GLfloat GVar13;
  GLfloat GVar14;
  GLfloat GVar15;
  float fVar16;
  
  if (5 < face) goto LAB_00d6dd65;
  fVar9 = 2.0 / (float)width;
  fVar5 = 2.0 / (float)height;
  GVar12 = -1.0;
  fVar2 = 1.0;
  fVar8 = fVar9 * 0.5 + -1.0 + fVar9;
  GVar3 = (1.0 - fVar9 * 0.5) - fVar9;
  GVar10 = (1.0 - fVar5 * 0.5) - fVar5;
  fVar5 = fVar5 * 0.5 + -1.0 + fVar5;
  GVar13 = 0.0;
  GVar14 = GVar3;
  switch(face) {
  case 0:
    uVar6 = 0x3f800000;
    goto LAB_00d6dc54;
  case 1:
    uVar6 = 0xbf800000;
    fVar2 = -1.0;
LAB_00d6dc54:
    uVar7 = (ulong)uVar6;
    fVar9 = 0.0;
    fVar4 = GVar3;
    fVar11 = 0.0;
    GVar14 = fVar2;
    GVar15 = fVar8;
    GVar12 = fVar5;
    fVar5 = fVar8;
    fVar16 = GVar3;
    break;
  case 2:
    uVar7 = 0x3f80000000000000;
    fVar9 = 1.0;
    fVar2 = fVar8;
    fVar4 = fVar9;
    fVar8 = fVar9;
    fVar11 = fVar9;
    GVar15 = fVar9;
    GVar12 = fVar5;
    GVar3 = fVar9;
    fVar5 = fVar9;
    fVar16 = fVar9;
    break;
  case 3:
    uVar7 = 0xbf80000000000000;
    fVar9 = -1.0;
    fVar2 = fVar8;
    fVar4 = fVar9;
    fVar8 = fVar9;
    fVar11 = fVar9;
    GVar15 = fVar9;
    GVar12 = fVar5;
    GVar3 = fVar9;
    fVar5 = fVar9;
    fVar16 = fVar9;
    break;
  case 4:
    GVar12 = 1.0;
    goto LAB_00d6dc7e;
  case 5:
LAB_00d6dc7e:
    uVar7 = 0;
    fVar9 = fVar5;
    fVar2 = fVar8;
    fVar4 = GVar10;
    fVar8 = GVar10;
    fVar11 = GVar10;
    GVar10 = GVar12;
    GVar13 = GVar12;
    GVar15 = 0.0;
    GVar3 = 0.0;
    fVar16 = fVar5;
  }
  *data = fVar2;
  data[1] = fVar8;
  data[2] = GVar10;
  data[3] = layer;
  data[4] = (GLfloat)uVar7;
  data[5] = fVar11;
  data[6] = GVar10;
  data[7] = layer;
  data[8] = GVar14;
  data[9] = fVar4;
  data[10] = GVar10;
  data[0xb] = layer;
  data[0xc] = fVar2;
  data[0xd] = GVar15;
  data[0xe] = GVar13;
  data[0xf] = layer;
  *(ulong *)(data + 0x10) = uVar7;
  data[0x12] = GVar13;
  data[0x13] = layer;
  data[0x14] = GVar14;
  data[0x15] = GVar3;
  data[0x16] = GVar13;
  data[0x17] = layer;
  data[0x18] = fVar2;
  data[0x19] = fVar5;
  data[0x1a] = GVar12;
  data[0x1b] = layer;
  data[0x1c] = (GLfloat)uVar7;
  data[0x1d] = fVar9;
  data[0x1e] = GVar12;
  data[0x1f] = layer;
  data[0x20] = GVar14;
  data[0x21] = fVar16;
  data[0x22] = GVar12;
  data[0x23] = layer;
LAB_00d6dd65:
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1] * data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1] = data[lVar1] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 4] * data[lVar1 + 4];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 4] = data[lVar1 + 4] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 8] * data[lVar1 + 8];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 8] = data[lVar1 + 8] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0xc] * data[lVar1 + 0xc];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0xc] = data[lVar1 + 0xc] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x10] * data[lVar1 + 0x10];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x10] = data[lVar1 + 0x10] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x14] * data[lVar1 + 0x14];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x14] = data[lVar1 + 0x14] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x18] * data[lVar1 + 0x18];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x18] = data[lVar1 + 0x18] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x1c] * data[lVar1 + 0x1c];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x1c] = data[lVar1 + 0x1c] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + data[lVar1 + 0x20] * data[lVar1 + 0x20];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  lVar1 = 0;
  do {
    data[lVar1 + 0x20] = data[lVar1 + 0x20] * (1.0 / fVar2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void prepareTextureCoordinatesForGatherForFace(glw::GLfloat* data, glw::GLuint width, glw::GLuint height,
											   glw::GLfloat layer, glw::GLuint face)
{
	const glw::GLfloat x_range = (glw::GLfloat)width;
	const glw::GLfloat y_range = (glw::GLfloat)height;

	const glw::GLfloat x_step = 2.0f / x_range;
	const glw::GLfloat y_step = 2.0f / y_range;

	const glw::GLfloat x_mid_step = x_step / 2.0f;
	const glw::GLfloat y_mid_step = y_step / 2.0f;

	const glw::GLfloat left		= -1.0f + x_mid_step + x_step;
	const glw::GLfloat right	= 1.0f - x_mid_step - x_step;
	const glw::GLfloat top		= 1.0f - y_mid_step - y_step;
	const glw::GLfloat bottom   = -1.0f + y_mid_step + y_step;
	const glw::GLfloat middle   = 0.0f;
	const glw::GLfloat negative = -1.0f;
	const glw::GLfloat positive = 1.0f;

	switch (face)
	{
	case 0:
		vectorSet4(data, 0, positive, left, top, layer);
		vectorSet4(data, 1, positive, middle, top, layer);
		vectorSet4(data, 2, positive, right, top, layer);
		vectorSet4(data, 3, positive, left, middle, layer);
		vectorSet4(data, 4, positive, middle, middle, layer);
		vectorSet4(data, 5, positive, right, middle, layer);
		vectorSet4(data, 6, positive, left, bottom, layer);
		vectorSet4(data, 7, positive, middle, bottom, layer);
		vectorSet4(data, 8, positive, right, bottom, layer);
		break;
	case 1:
		vectorSet4(data, 0, negative, left, top, layer);
		vectorSet4(data, 1, negative, middle, top, layer);
		vectorSet4(data, 2, negative, right, top, layer);
		vectorSet4(data, 3, negative, left, middle, layer);
		vectorSet4(data, 4, negative, middle, middle, layer);
		vectorSet4(data, 5, negative, right, middle, layer);
		vectorSet4(data, 6, negative, left, bottom, layer);
		vectorSet4(data, 7, negative, middle, bottom, layer);
		vectorSet4(data, 8, negative, right, bottom, layer);
		break;
	case 2:
		vectorSet4(data, 0, left, positive, top, layer);
		vectorSet4(data, 1, middle, positive, top, layer);
		vectorSet4(data, 2, right, positive, top, layer);
		vectorSet4(data, 3, left, positive, middle, layer);
		vectorSet4(data, 4, middle, positive, middle, layer);
		vectorSet4(data, 5, right, positive, middle, layer);
		vectorSet4(data, 6, left, positive, bottom, layer);
		vectorSet4(data, 7, middle, positive, bottom, layer);
		vectorSet4(data, 8, right, positive, bottom, layer);
		break;
	case 3:
		vectorSet4(data, 0, left, negative, top, layer);
		vectorSet4(data, 1, middle, negative, top, layer);
		vectorSet4(data, 2, right, negative, top, layer);
		vectorSet4(data, 3, left, negative, middle, layer);
		vectorSet4(data, 4, middle, negative, middle, layer);
		vectorSet4(data, 5, right, negative, middle, layer);
		vectorSet4(data, 6, left, negative, bottom, layer);
		vectorSet4(data, 7, middle, negative, bottom, layer);
		vectorSet4(data, 8, right, negative, bottom, layer);
		break;
	case 4:
		vectorSet4(data, 0, left, top, positive, layer);
		vectorSet4(data, 1, middle, top, positive, layer);
		vectorSet4(data, 2, right, top, positive, layer);
		vectorSet4(data, 3, left, middle, positive, layer);
		vectorSet4(data, 4, middle, middle, positive, layer);
		vectorSet4(data, 5, right, middle, positive, layer);
		vectorSet4(data, 6, left, bottom, positive, layer);
		vectorSet4(data, 7, middle, bottom, positive, layer);
		vectorSet4(data, 8, right, bottom, positive, layer);
		break;
	case 5:
		vectorSet4(data, 0, left, top, negative, layer);
		vectorSet4(data, 1, middle, top, negative, layer);
		vectorSet4(data, 2, right, top, negative, layer);
		vectorSet4(data, 3, left, middle, negative, layer);
		vectorSet4(data, 4, middle, middle, negative, layer);
		vectorSet4(data, 5, right, middle, negative, layer);
		vectorSet4(data, 6, left, bottom, negative, layer);
		vectorSet4(data, 7, middle, bottom, negative, layer);
		vectorSet4(data, 8, right, bottom, negative, layer);
		break;
	};

	vectorNormalize<3, 4>(data, 0);
	vectorNormalize<3, 4>(data, 1);
	vectorNormalize<3, 4>(data, 2);
	vectorNormalize<3, 4>(data, 3);
	vectorNormalize<3, 4>(data, 4);
	vectorNormalize<3, 4>(data, 5);
	vectorNormalize<3, 4>(data, 6);
	vectorNormalize<3, 4>(data, 7);
	vectorNormalize<3, 4>(data, 8);
}